

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# MockExpectedCallTest.cpp
# Opt level: O3

void __thiscall
TEST_MockExpectedCall_callWithUnsignedLongLongIntegerParameter_Test::
~TEST_MockExpectedCall_callWithUnsignedLongLongIntegerParameter_Test
          (TEST_MockExpectedCall_callWithUnsignedLongLongIntegerParameter_Test *this)

{
  Utest::~Utest((Utest *)this);
  operator_delete(this,0x18);
  return;
}

Assistant:

TEST(MockExpectedCall, callWithUnsignedLongLongIntegerParameter)
{
    const SimpleString paramName = "paramName";
    unsigned long long value = 888;
    call->withParameter(paramName, value);
    STRCMP_EQUAL("unsigned long long int", call->getInputParameterType(paramName).asCharString());
    UNSIGNED_LONGLONGS_EQUAL(value, call->getInputParameter(paramName).getUnsignedLongLongIntValue());
    CHECK(call->hasInputParameterWithName(paramName));
    STRCMP_CONTAINS("funcName -> unsigned long long int paramName: <888 (0x378)>", call->callToString().asCharString());
}